

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockTHUMB59TAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  long lVar1;
  byte bVar2;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8 y;
  int in_stack_00000018;
  uint8 x;
  int channelsA;
  uint8 block_mask [4] [4];
  uint8 distance;
  uint8 paint_colors [4] [3];
  uint8 colors [2] [3];
  uint8 colorsRGB444 [2] [3];
  byte local_5e;
  byte local_5d;
  int local_5c;
  byte local_58 [8];
  uint8 (*in_stack_ffffffffffffffb0) [3];
  uint8 (*in_stack_ffffffffffffffb8) [3];
  uint8 in_stack_ffffffffffffffc6;
  byte local_38 [12];
  uint8 local_2c [6];
  byte local_26;
  byte local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  int local_1c;
  long local_18;
  long local_10;
  uint local_8;
  
  if (in_stack_00000018 == 3) {
    local_5c = 1;
    local_18 = in_RCX;
  }
  else {
    local_5c = 4;
    local_18 = in_RDX + 3;
  }
  local_26 = (byte)(in_EDI >> 0x17) & 0xf;
  local_25 = (byte)(in_EDI >> 0x13) & 0xf;
  local_24 = (byte)(in_EDI >> 0xf) & 0xf;
  local_23 = (byte)(in_EDI >> 0xb) & 0xf;
  local_22 = (byte)(in_EDI >> 7) & 0xf;
  local_21 = (byte)(in_EDI >> 3) & 0xf;
  bVar2 = (byte)in_EDI & 7;
  local_1c = in_R8D;
  local_10 = in_RDX;
  local_8 = in_ESI;
  decompressColor(4,4,4,(uint8 (*) [3])&local_26,(uint8 (*) [3])local_2c);
  calculatePaintColors59T
            (bVar2,in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  for (local_5d = 0; local_5d < 4; local_5d = local_5d + 1) {
    for (local_5e = 0; local_5e < 4; local_5e = local_5e + 1) {
      local_58[(ulong)local_5e + (ulong)local_5d * 4] =
           (byte)((local_8 >> (local_5e + local_5d * '\x04' + 0x10 & 0x1f) & 1) << 1);
      lVar1 = (ulong)local_5d * 4 + -0x58;
      local_58[(ulong)local_5e + lVar1 + 0x58] =
           local_58[(ulong)local_5e + lVar1 + 0x58] |
           (byte)(local_8 >> (local_5e + local_5d * '\x04' & 0x1f)) & 1;
      if ((int)(uint)local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3] < 0) {
        bVar2 = 0;
      }
      else if (local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3] < 0x100) {
        bVar2 = local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3];
      }
      else {
        bVar2 = 0xff;
      }
      *(byte *)(local_10 +
               (int)(in_stack_00000018 *
                    ((in_stack_00000010 + (uint)local_5e) * local_1c + in_stack_00000008 +
                    (uint)local_5d))) = bVar2;
      if ((int)(uint)local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 1] < 0) {
        bVar2 = 0;
      }
      else if (local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 1] < 0x100) {
        bVar2 = local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 1];
      }
      else {
        bVar2 = 0xff;
      }
      *(byte *)(local_10 +
               (int)(in_stack_00000018 *
                     ((in_stack_00000010 + (uint)local_5e) * local_1c + in_stack_00000008 +
                     (uint)local_5d) + 1)) = bVar2;
      if ((int)(uint)local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 2] < 0) {
        bVar2 = 0;
      }
      else if (local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 2] < 0x100) {
        bVar2 = local_38[(ulong)local_58[(ulong)local_5e + (ulong)local_5d * 4] * 3 + 2];
      }
      else {
        bVar2 = 0xff;
      }
      *(byte *)(local_10 +
               (int)(in_stack_00000018 *
                     ((in_stack_00000010 + (uint)local_5e) * local_1c + in_stack_00000008 +
                     (uint)local_5d) + 2)) = bVar2;
      if (local_58[(ulong)local_5e + (ulong)local_5d * 4] == 2) {
        *(undefined1 *)
         (local_18 +
         (int)(local_5c *
              ((uint)local_5d + in_stack_00000008 + ((uint)local_5e + in_stack_00000010) * local_1c)
              )) = 0;
        *(undefined1 *)
         (local_10 +
         (int)(in_stack_00000018 *
              ((in_stack_00000010 + (uint)local_5e) * local_1c + in_stack_00000008 + (uint)local_5d)
              )) = 0;
        *(undefined1 *)
         (local_10 +
         (int)(in_stack_00000018 *
               ((in_stack_00000010 + (uint)local_5e) * local_1c + in_stack_00000008 + (uint)local_5d
               ) + 1)) = 0;
        *(undefined1 *)
         (local_10 +
         (int)(in_stack_00000018 *
               ((in_stack_00000010 + (uint)local_5e) * local_1c + in_stack_00000008 + (uint)local_5d
               ) + 2)) = 0;
      }
      else {
        *(undefined1 *)
         (local_18 +
         (int)(local_5c *
              ((uint)local_5d + in_stack_00000008 + ((uint)local_5e + in_stack_00000010) * local_1c)
              )) = 0xff;
      }
    }
  }
  return;
}

Assistant:

void decompressBlockTHUMB59TAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{

	uint8 colorsRGB444[2][3];
	uint8 colors[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
  int channelsA;

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 58);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 54);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 50);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 46);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 42);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 38);

	distance   = GETBITSHIGH(block_part1, TABLE_BITS_59T, 34);

	// Extend the two colors to RGB888	
	decompressColor(R_BITS59T, G_BITS59T, B_BITS59T, colorsRGB444, colors);	
	calculatePaintColors59T(distance, PATTERN_T, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channelsRGB*((starty+y)*width+startx+x)+R] = 
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channelsRGB*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channelsRGB*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
			if(block_mask[x][y]==2)  
			{
				alpha[channelsA*(x+startx+(y+starty)*width)]=0;
				img[channelsRGB*((starty+y)*width+startx+x)+R] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+G] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+B] =0;
			}
			else
				alpha[channelsA*(x+startx+(y+starty)*width)]=255;
		}
	}
}